

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void instrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  u8 uVar1;
  u8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *__s1;
  void *__s2;
  ulong uVar7;
  uint uVar8;
  
  uVar1 = (*argv)->type;
  uVar2 = argv[1]->type;
  if (uVar2 != '\x05' && uVar1 != '\x05') {
    iVar4 = sqlite3ValueBytes(*argv,'\x01');
    iVar5 = sqlite3ValueBytes(argv[1],'\x01');
    if (uVar2 == '\x04' && uVar1 == '\x04') {
      __s1 = sqlite3_value_blob(*argv);
      __s2 = sqlite3_value_blob(argv[1]);
    }
    else {
      __s1 = sqlite3ValueText(*argv,'\x01');
      __s2 = sqlite3ValueText(argv[1],'\x01');
    }
    if (iVar4 < iVar5) {
      uVar7 = 0;
    }
    else {
      uVar8 = 1;
      do {
        iVar6 = bcmp(__s1,__s2,(long)iVar5);
        if (iVar6 == 0) goto LAB_001a185c;
        uVar8 = uVar8 + 1;
        __s1 = (void *)((long)__s1 + 1);
        bVar3 = iVar5 < iVar4;
        iVar4 = iVar4 + -1;
      } while (bVar3);
      uVar8 = 0;
LAB_001a185c:
      uVar7 = (ulong)uVar8;
    }
    sqlite3VdbeMemRelease(&context->s);
    (context->s).u.i = uVar7;
    (context->s).flags = 4;
    (context->s).type = '\x01';
  }
  return;
}

Assistant:

static void instrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zHaystack;
  const unsigned char *zNeedle;
  int nHaystack;
  int nNeedle;
  int typeHaystack, typeNeedle;
  int N = 1;
  int isText;

  UNUSED_PARAMETER(argc);
  typeHaystack = sqlite3_value_type(argv[0]);
  typeNeedle = sqlite3_value_type(argv[1]);
  if( typeHaystack==SQLITE_NULL || typeNeedle==SQLITE_NULL ) return;
  nHaystack = sqlite3_value_bytes(argv[0]);
  nNeedle = sqlite3_value_bytes(argv[1]);
  if( typeHaystack==SQLITE_BLOB && typeNeedle==SQLITE_BLOB ){
    zHaystack = sqlite3_value_blob(argv[0]);
    zNeedle = sqlite3_value_blob(argv[1]);
    isText = 0;
  }else{
    zHaystack = sqlite3_value_text(argv[0]);
    zNeedle = sqlite3_value_text(argv[1]);
    isText = 1;
  }
  while( nNeedle<=nHaystack && memcmp(zHaystack, zNeedle, nNeedle)!=0 ){
    N++;
    do{
      nHaystack--;
      zHaystack++;
    }while( isText && (zHaystack[0]&0xc0)==0x80 );
  }
  if( nNeedle>nHaystack ) N = 0;
  sqlite3_result_int(context, N);
}